

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall MPLSParser::parsePlayList(MPLSParser *this,uint8_t *buffer,int len)

{
  uint uVar1;
  uint uVar2;
  uint PlayItem_id;
  BitStreamReader reader;
  BitStreamReader local_40;
  
  PlayItem_id = 0;
  local_40.super_BitStream.m_totalBits = 0;
  local_40.super_BitStream.m_buffer = (uint *)0x0;
  local_40.super_BitStream.m_initBuffer = (uint *)0x0;
  local_40.m_curVal = 0;
  local_40.m_bitLeft = 0;
  BitStream::setBuffer(&local_40.super_BitStream,buffer,buffer + len);
  local_40._24_8_ = local_40._24_8_ & 0xffffffff;
  local_40.m_curVal = BitStreamReader::getCurVal(&local_40,local_40.super_BitStream.m_buffer);
  local_40.m_bitLeft = 0x20;
  BitStreamReader::skipBits(&local_40,0x20);
  BitStreamReader::skipBits(&local_40,0x10);
  uVar1 = BitStreamReader::getBits(&local_40,0x10);
  uVar2 = BitStreamReader::getBits(&local_40,0x10);
  this->number_of_SubPaths = uVar2;
  if (0 < (int)uVar1) {
    do {
      parsePlayItem(this,&local_40,PlayItem_id);
      PlayItem_id = PlayItem_id + 1;
    } while (uVar1 != PlayItem_id);
  }
  return;
}

Assistant:

void MPLSParser::parsePlayList(uint8_t* buffer, const int len)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + len);
    reader.skipBits(32);  // length
    reader.skipBits(16);  // reserved_for_future_use
    const int number_of_PlayItems = reader.getBits<int>(16);
    number_of_SubPaths = reader.getBits<int>(16);
    for (int PlayItem_id = 0; PlayItem_id < number_of_PlayItems; PlayItem_id++)
    {
        parsePlayItem(reader, PlayItem_id);
    }
    for (int SubPath_id = 0; SubPath_id < number_of_SubPaths; SubPath_id++)
    {
        // SubPath(); // not implemented now
    }
}